

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_bauth.c
# Opt level: O0

err_t btokBAuthCTStep4(octet *out,octet *in,void *state)

{
  bool_t bVar1;
  word *mod;
  octet *level;
  word *b;
  word wVar2;
  long *in_RDX;
  word *in_RSI;
  u64 *in_RDI;
  void *stack;
  word *sct;
  word *t;
  octet *K2;
  octet *K1;
  octet *block1;
  octet *block0;
  octet *Y;
  size_t no;
  size_t n;
  bake_bauth_ct_o *s;
  void *in_stack_ffffffffffffff68;
  word *a;
  word *c;
  word *b_00;
  word *n_00;
  word *a_00;
  word *c_00;
  word *n_01;
  word *a_01;
  word *r;
  
  bVar1 = objIsOperable(in_stack_ffffffffffffff68);
  if (bVar1 != 0) {
    r = *(word **)(*(long *)(in_RDX[3] + 0x18) + 0x30);
    a_01 = *(word **)(*(long *)(in_RDX[3] + 0x18) + 0x38);
    if (*(int *)((long)in_RDX + 0x194) == -8) {
      mod = (word *)0x0;
    }
    else {
      mod = (word *)((ulong)a_01 >> 1);
    }
    bVar1 = memIsValid(in_RSI,(size_t)mod);
    if (bVar1 != 0) {
      if (*(int *)((long)in_RDX + 0x194) == 0) {
        level = (octet *)0x0;
      }
      else {
        level = (octet *)((long)a_01 + in_RDX[0x3a] + 8);
      }
      bVar1 = memIsValid(in_RDI,(size_t)level);
      if (bVar1 != 0) {
        b = (word *)((long)in_RDX + *in_RDX);
        a_00 = b + 2;
        b_00 = b + 6;
        c = b_00 + ((ulong)r >> 1);
        c_00 = b + 10;
        n_00 = c + (long)r + ((ulong)r >> 1) + 1;
        a = c + (long)r + ((ulong)r >> 1) + 5;
        n_01 = b_00;
        beltHashStart(in_RDI);
        beltHashStepH(in_RSI,(size_t)mod,in_RDI);
        if (*(int *)((long)in_RDX + 0x194) != 0) {
          beltHashStepH(in_RSI,(size_t)mod,in_RDI);
        }
        if (in_RDX[0x33] != 0) {
          beltHashStepH(in_RSI,(size_t)mod,in_RDI);
        }
        if (in_RDX[0x35] != 0) {
          beltHashStepH(in_RSI,(size_t)mod,in_RDI);
        }
        beltHashStepG((octet *)in_RDI,level);
        memSet(in_RDI,(octet)((ulong)level >> 0x38),0x15dea7);
        memSet(in_RDI,(octet)((ulong)level >> 0x38),0x15debb);
        beltKRPStart(in_RSI,(octet *)mod,(size_t)in_RDI,level);
        beltKRPStepG((octet *)c,(size_t)a,(octet *)in_RSI,mod);
        *(undefined1 *)b = 1;
        beltKRPStepG((octet *)c,(size_t)a,(octet *)in_RSI,mod);
        if (*(int *)((long)in_RDX + 0x194) != 0) {
          *(undefined1 *)b = 2;
          beltKRPStepG((octet *)c,(size_t)a,(octet *)in_RSI,mod);
        }
        *(undefined1 *)b = 0;
        beltMACStart(in_RSI,(octet *)mod,(size_t)in_RDI);
        beltMACStepA(in_RSI,(size_t)mod,in_RDI);
        bVar1 = beltMACStepV((octet *)in_RDI,level);
        if (bVar1 != 0) {
          if (*(int *)((long)in_RDX + 0x194) != 0) {
            beltHashStart(in_RDI);
            beltHashStepH(in_RSI,(size_t)mod,in_RDI);
            beltHashStepH(in_RSI,(size_t)mod,in_RDI);
            beltHashStepG2((octet *)in_RSI,(size_t)mod,in_RDI);
            u64From(in_RDI,level,0x15e018);
            zzMul(c_00,a_00,(size_t)n_00,b_00,(size_t)c,a);
            wVar2 = zzAdd2(c + ((ulong)r >> 1),(word *)in_RDX[4],(size_t)r);
            c[(long)r + ((ulong)r >> 1)] = wVar2;
            zzMod(r,a_01,(size_t)n_01,b,(size_t)c_00,a_00);
            zzSubMod(c,a,in_RSI,mod,(size_t)in_RDI);
            u64To(in_RDI,(size_t)level,(u64 *)0x15e100);
            memCopy(in_RDI,level,0x15e12a);
            *(undefined1 *)b = 0;
            beltCFBStart(in_RSI,(octet *)mod,(size_t)in_RDI,level);
            beltCFBStepE(in_RSI,(size_t)mod,in_RDI);
            beltMACStart(in_RSI,(octet *)mod,(size_t)in_RDI);
            beltMACStepA(in_RSI,(size_t)mod,in_RDI);
            beltMACStepG((octet *)in_RDI,level);
          }
          return 0;
        }
        return 0x209;
      }
    }
  }
  return 0x6d;
}

Assistant:

err_t btokBAuthCTStep4(octet out[], const octet in[], void* state)
{
	bake_bauth_ct_o* s = (bake_bauth_ct_o*)state;
	size_t n, no;
	// стек
	octet* Y;		/* [32] (совпадает c t, sct) */
	octet* block0;	/* [16] (следует перед Y) */
	octet* block1;	/* [16] (следует за Y) */
	octet* K1;		/* [32] общий ключ (совпадает с Y) */
	octet* K2;		/* [32] общий ключ */
	word* t;		/* [n / 2 + 1] (совпадает c Y, sct) */
	word* sct;		/* [n + n / 2 + 1] (совпадает c Y, t) */
	void* stack;
	// проверить входные данные
	if (!objIsOperable(s))
		return ERR_BAD_INPUT;
	n = s->ec->f->n, no = s->ec->f->no;
	if (!memIsValid(in, 8u + s->settings->kcb ? no / 2 : 0) ||
		!memIsValid(out, s->settings->kcb ? (8u + no + s->cert->len) : 0))
		return ERR_BAD_INPUT;
	ASSERT(memIsDisjoint2(out, s->settings->kcb ?
		(8u + O_OF_B(2 * s->params->l) + s->cert->len) : 0, s, objKeep(s)));
	block0 = objEnd(s, octet);
	K1 = block0 + 16;
	Y = K1 + 32;
	t = (word*)Y;
	sct = t + n / 2;
	block1 = Y + 32;
	K2 = (octet*)(sct + n + n / 2 + 1);
	stack = K2 + 32;
	// Y <- beltHash(<Rct>_l || [<Rt>_l ||] helloa || hellob)
	beltHashStart(stack);
	beltHashStepH(s->R, no / 2, stack);
	if (s->settings->kcb)
  	beltHashStepH(in + 8, no / 2, stack);
	if (s->settings->helloa)
		beltHashStepH(s->settings->helloa, s->settings->helloa_len, stack);
	if (s->settings->hellob)
		beltHashStepH(s->settings->hellob, s->settings->hellob_len, stack);
	ASSERT(no >= 32);
	beltHashStepG(Y, stack);
	// K0 <- beltKRP(Y, 1^96, 0)
	memSetZero(block0, 16);
	memSet(block1, 0xFF, 16);
	beltKRPStart(stack, Y, 32, block1);
	beltKRPStepG(s->K0, 32, block0, stack);
	// K1 <- beltKRP(Y, 1^96, 1)
	block0[0] = 1;
	beltKRPStepG(K1, 32, block0, stack);
	// K2 <- beltKRP(Y, 1^96, 2)
	if (s->settings->kcb)
	{
		block0[0] = 2;
		beltKRPStepG(K2, 32, block0, stack);
	}
	// Tt == beltMAC(0^128, K1)?
	block0[0] = 0;
	beltMACStart(stack, K1, 32);
	beltMACStepA(block0, 16, stack);
	if (!beltMACStepV(in, stack))
		return ERR_AUTH;
	if (s->settings->kcb)
	{
		// t <- <beltHash(<Vct>_2l || Rt)>_l
		beltHashStart(stack);
		beltHashStepH(s->V, no, stack);
		beltHashStepH(in + 8, 16, stack);
		beltHashStepG2((octet*)t, no / 2, stack);
		wwFrom(t, t, no / 2);
		// sct <- (uct - (2^l + t)dct) \mod q
		zzMul(sct, t, n / 2, s->d, n, stack);
		sct[n + n / 2] = zzAdd2(sct + n / 2, s->d, n);
		zzMod(sct, sct, n + n / 2 + 1, s->ec->order, n, stack);
		zzSubMod(sct, s->u, sct, s->ec->order, n);
  		// out ||.. <- sct || cert_ct
		wwTo(out, no, sct);
		memCopy(out + no, s->cert->data, s->cert->len);
		// out ||.. <- beltCFBEncr(sct || cert_ct, K2, 0^128)
		block0[0] = 0;
		beltCFBStart(stack, K2, 32, block0);
		beltCFBStepE(out, no + s->cert->len, stack);
		// ..|| out <- beltMAC(beltCFBEncr(sct || cert_ct))
		beltMACStart(stack, K1, 32);
		beltMACStepA(out, no + s->cert->len, stack);
		beltMACStepG(out + no + s->cert->len, stack);
	}
	// все нормально
	return ERR_OK;
}